

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int g_iofile(lua_State *L,int f,char *mode)

{
  int iVar1;
  char *__filename;
  FILE **ppFVar2;
  FILE *pFVar3;
  FILE **pf;
  char *filename;
  char *mode_local;
  int f_local;
  lua_State *L_local;
  
  iVar1 = lua_type(L,1);
  if (0 < iVar1) {
    __filename = lua_tolstring(L,1,(size_t *)0x0);
    if (__filename == (char *)0x0) {
      tofile(L);
      lua_pushvalue(L,1);
    }
    else {
      ppFVar2 = newfile(L);
      pFVar3 = fopen(__filename,mode);
      *ppFVar2 = (FILE *)pFVar3;
      if (*ppFVar2 == (FILE *)0x0) {
        fileerror(L,1,__filename);
      }
    }
    lua_rawseti(L,-0x2711,f);
  }
  lua_rawgeti(L,-0x2711,f);
  return 1;
}

Assistant:

static int g_iofile(lua_State*L,int f,const char*mode){
if(!lua_isnoneornil(L,1)){
const char*filename=lua_tostring(L,1);
if(filename){
FILE**pf=newfile(L);
*pf=fopen(filename,mode);
if(*pf==NULL)
fileerror(L,1,filename);
}
else{
tofile(L);
lua_pushvalue(L,1);
}
lua_rawseti(L,(-10001),f);
}
lua_rawgeti(L,(-10001),f);
return 1;
}